

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O1

CURLcode easysrc_perform(void)

{
  curl_slist *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  long lVar5;
  
  if (easysrc_toohard == (slist_wc *)0x0) goto LAB_0010d407;
  CVar3 = easysrc_add(&easysrc_code,"");
  CVar4 = CVar3;
  if (CVar3 == CURLE_OK) {
    lVar5 = 0;
    do {
      CVar4 = easysrc_add(&easysrc_code,*(char **)((long)srchard + lVar5));
      if (CVar4 != CURLE_OK) goto LAB_0010d3ff;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    if (easysrc_toohard != (slist_wc *)0x0) {
      for (pcVar1 = easysrc_toohard->first; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
        CVar4 = easysrc_add(&easysrc_code,pcVar1->data);
        if (CVar4 != CURLE_OK) goto LAB_0010d3ff;
      }
    }
    CVar4 = easysrc_add(&easysrc_code,"");
    if ((CVar4 != CURLE_OK) || (CVar4 = easysrc_add(&easysrc_code,"*/"), CVar4 != CURLE_OK))
    goto LAB_0010d3ff;
    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = (slist_wc *)0x0;
    bVar2 = true;
  }
  else {
LAB_0010d3ff:
    bVar2 = false;
    CVar3 = CVar4;
  }
  if (!bVar2) {
    return CVar3;
  }
LAB_0010d407:
  CVar4 = easysrc_add(&easysrc_code,"");
  if ((CVar4 == CURLE_OK) &&
     (CVar4 = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);"), CVar4 == CURLE_OK)) {
    CVar4 = easysrc_add(&easysrc_code,"");
    return CVar4;
  }
  return CVar4;
}

Assistant:

CURLcode easysrc_perform(void)
{
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    const char *c;
    CHKRET(easysrc_add(&easysrc_code, ""));
    /* Preamble comment */
    for(i = 0; ((c = srchard[i]) != NULL); i++)
      CHKRET(easysrc_add(&easysrc_code, c));
    /* Each unconverted option */
    if(easysrc_toohard) {
      for(ptr = easysrc_toohard->first; ptr; ptr = ptr->next)
        CHKRET(easysrc_add(&easysrc_code, ptr->data));
    }
    CHKRET(easysrc_add(&easysrc_code, ""));
    CHKRET(easysrc_add(&easysrc_code, "*/"));

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  CHKRET(easysrc_add(&easysrc_code, ""));
  CHKRET(easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);"));
  CHKRET(easysrc_add(&easysrc_code, ""));

  return CURLE_OK;
}